

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::DeadBranchElimPass::FixPhiNodesInLiveBlocks
          (DeadBranchElimPass *this,Function *func,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *live_blocks,
          unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
          *unreachable_continues)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  Op OVar5;
  uint32_t uVar6;
  iterator this_00;
  size_type sVar7;
  Instruction *pIVar8;
  Operand *pOVar9;
  pointer pvVar10;
  DefUseManager *pDVar11;
  size_type sVar12;
  size_type sVar13;
  reference pvVar14;
  uint *puVar15;
  IRContext *pIVar16;
  iterator local_128;
  uint local_120;
  uint32_t local_11c;
  uint32_t replId;
  size_type local_110;
  spv_operand_type_t local_108;
  uint32_t local_104;
  initializer_list<unsigned_int> local_100;
  spv_operand_type_t local_ec;
  BasicBlock *local_e8;
  uint32_t local_e0;
  uint32_t local_dc;
  uint32_t continue_id;
  size_type local_d0;
  spv_operand_type_t local_c4;
  _Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false>
  local_c0;
  _Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false>
  local_b8;
  const_iterator cont_iter;
  BasicBlock *inc;
  undefined1 local_a0 [4];
  uint32_t i;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  Instruction *inst;
  undefined1 local_78 [6];
  bool backedge_added;
  bool changed;
  undefined1 local_70 [8];
  iterator iter;
  value_type *block;
  iterator __end2;
  iterator __begin2;
  Function *__range2;
  bool modified;
  unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
  *unreachable_continues_local;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *live_blocks_local;
  Function *func_local;
  DeadBranchElimPass *this_local;
  
  __range2._7_1_ = false;
  join_0x00000010_0x00000000_ = opt::Function::begin(func);
  _block = opt::Function::end(func);
  do {
    bVar2 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_,
                       (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&block);
    if (!bVar2) {
      return __range2._7_1_;
    }
    this_00.node_ =
         (Instruction *)
         UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                   ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_);
    iter.super_iterator.node_ = (iterator)(iterator)this_00.node_;
    sVar7 = std::
            unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
            ::count(live_blocks,(key_type *)&iter);
    if (sVar7 != 0) {
      BasicBlock::begin((BasicBlock *)local_70);
      while( true ) {
        BasicBlock::end((BasicBlock *)local_78);
        bVar2 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)local_70,
                                  (iterator_template<spvtools::opt::Instruction> *)local_78);
        if (!bVar2) break;
        pIVar8 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)local_70);
        OVar5 = opt::Instruction::opcode(pIVar8);
        if (OVar5 != OpPhi) break;
        bVar2 = false;
        bVar1 = false;
        operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)utils::IntrusiveList<spvtools::opt::Instruction>::
                      iterator_template<spvtools::opt::Instruction>::operator*
                                ((iterator_template<spvtools::opt::Instruction> *)local_70);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_a0);
        pOVar9 = opt::Instruction::GetOperand
                           ((Instruction *)
                            operands.
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_a0,pOVar9);
        pOVar9 = opt::Instruction::GetOperand
                           ((Instruction *)
                            operands.
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_a0,pOVar9);
        for (inc._4_4_ = 1;
            uVar6 = opt::Instruction::NumInOperands
                              ((Instruction *)
                               operands.
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage),
            inc._4_4_ < uVar6; inc._4_4_ = inc._4_4_ + 2) {
          uVar6 = opt::Instruction::GetSingleWordInOperand
                            ((Instruction *)
                             operands.
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,inc._4_4_);
          cont_iter.
          super__Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false>
          ._M_cur = (_Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false>
                     )GetParentBlock(this,uVar6);
          local_b8._M_cur =
               (__node_type *)
               std::
               unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
               ::find(unreachable_continues,(key_type *)&cont_iter);
          local_c0._M_cur =
               (__node_type *)
               std::
               unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
               ::end(unreachable_continues);
          bVar3 = std::__detail::operator!=(&local_b8,&local_c0);
          bVar4 = false;
          if (bVar3) {
            pvVar10 = std::__detail::
                      _Node_const_iterator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false,_false>
                      ::operator->((_Node_const_iterator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false,_false>
                                    *)&local_b8);
            bVar4 = false;
            if (pvVar10->second == (reference)this_00.node_) {
              uVar6 = opt::Instruction::NumInOperands
                                ((Instruction *)
                                 operands.
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
              bVar4 = 4 < uVar6;
            }
          }
          if (bVar4) {
            pDVar11 = Pass::get_def_use_mgr((Pass *)this);
            uVar6 = opt::Instruction::GetSingleWordInOperand
                              ((Instruction *)
                               operands.
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,inc._4_4_ - 1);
            pIVar8 = analysis::DefUseManager::GetDef(pDVar11,uVar6);
            OVar5 = opt::Instruction::opcode(pIVar8);
            if (OVar5 == OpUndef) {
              pOVar9 = opt::Instruction::GetInOperand
                                 ((Instruction *)
                                  operands.
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,inc._4_4_ - 1);
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
              push_back((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                        local_a0,pOVar9);
              pOVar9 = opt::Instruction::GetInOperand
                                 ((Instruction *)
                                  operands.
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,inc._4_4_);
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
              push_back((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                        local_a0,pOVar9);
            }
            else {
              local_c4 = SPV_OPERAND_TYPE_ID;
              uVar6 = opt::Instruction::type_id
                                ((Instruction *)
                                 operands.
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_dc = MemPass::Type2Undef(&this->super_MemPass,uVar6);
              _continue_id = &local_dc;
              local_d0 = 1;
              std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
              emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
                        ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                         local_a0,&local_c4,(initializer_list<unsigned_int> *)&continue_id);
              pOVar9 = opt::Instruction::GetInOperand
                                 ((Instruction *)
                                  operands.
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,inc._4_4_);
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
              push_back((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                        local_a0,pOVar9);
              bVar2 = true;
            }
            bVar1 = true;
          }
          else {
            sVar7 = std::
                    unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    ::count(live_blocks,(key_type *)&cont_iter);
            if ((sVar7 == 0) ||
               (bVar4 = BasicBlock::IsSuccessor
                                  ((BasicBlock *)
                                   cont_iter.
                                   super__Node_iterator_base<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>,_false>
                                   ._M_cur,(BasicBlock *)this_00.node_), !bVar4)) {
              bVar2 = true;
            }
            else {
              pOVar9 = opt::Instruction::GetInOperand
                                 ((Instruction *)
                                  operands.
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,inc._4_4_ - 1);
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
              push_back((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                        local_a0,pOVar9);
              pOVar9 = opt::Instruction::GetInOperand
                                 ((Instruction *)
                                  operands.
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,inc._4_4_);
              std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
              push_back((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                        local_a0,pOVar9);
            }
          }
        }
        if (bVar2) {
          __range2._7_1_ = true;
          local_e0 = BasicBlock::ContinueBlockIdIfAny((BasicBlock *)this_00.node_);
          bVar2 = false;
          if ((!bVar1) && (bVar2 = false, local_e0 != 0)) {
            local_e8 = GetParentBlock(this,local_e0);
            sVar12 = std::
                     unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
                     ::count(unreachable_continues,&local_e8);
            bVar2 = false;
            if (sVar12 != 0) {
              sVar13 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ::size((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               *)local_a0);
              bVar2 = 4 < sVar13;
            }
          }
          if (bVar2) {
            local_ec = SPV_OPERAND_TYPE_ID;
            uVar6 = opt::Instruction::type_id
                              ((Instruction *)
                               operands.
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_104 = MemPass::Type2Undef(&this->super_MemPass,uVar6);
            local_100._M_array = &local_104;
            local_100._M_len = 1;
            std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
            emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
                      ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                       local_a0,&local_ec,&local_100);
            local_108 = SPV_OPERAND_TYPE_ID;
            local_11c = local_e0;
            _replId = &local_11c;
            local_110 = 1;
            std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
            emplace_back<spv_operand_type_t,std::initializer_list<unsigned_int>>
                      ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                       local_a0,&local_108,(initializer_list<unsigned_int> *)&replId);
          }
          sVar13 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                   size((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                        local_a0);
          if (sVar13 == 4) {
            pvVar14 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                      operator[]((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  *)local_a0,2);
            puVar15 = utils::SmallVector<unsigned_int,_2UL>::operator[](&pvVar14->words,0);
            local_120 = *puVar15;
            pIVar16 = Pass::context((Pass *)this);
            uVar6 = opt::Instruction::result_id
                              ((Instruction *)
                               operands.
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            IRContext::KillNamesAndDecorates(pIVar16,uVar6);
            pIVar16 = Pass::context((Pass *)this);
            uVar6 = opt::Instruction::result_id
                              ((Instruction *)
                               operands.
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            IRContext::ReplaceAllUsesWith(pIVar16,uVar6,local_120);
            pIVar16 = Pass::context((Pass *)this);
            pIVar8 = IRContext::KillInst(pIVar16,(Instruction *)
                                                 operands.
                                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)
            ;
            InstructionList::iterator::iterator(&local_128,pIVar8);
            InstructionList::iterator::operator=((iterator *)local_70,&local_128);
          }
          else {
            pDVar11 = Pass::get_def_use_mgr((Pass *)this);
            analysis::DefUseManager::EraseUseRecordsOfOperandIds
                      (pDVar11,(Instruction *)
                               operands.
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            opt::Instruction::ReplaceOperands
                      ((Instruction *)
                       operands.
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(OperandList *)local_a0);
            pDVar11 = Pass::get_def_use_mgr((Pass *)this);
            analysis::DefUseManager::AnalyzeInstUse
                      (pDVar11,(Instruction *)
                               operands.
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
            InstructionList::iterator::operator++((iterator *)local_70);
          }
        }
        else {
          InstructionList::iterator::operator++((iterator *)local_70);
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_a0);
      }
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_);
  } while( true );
}

Assistant:

bool DeadBranchElimPass::FixPhiNodesInLiveBlocks(
    Function* func, const std::unordered_set<BasicBlock*>& live_blocks,
    const std::unordered_map<BasicBlock*, BasicBlock*>& unreachable_continues) {
  bool modified = false;
  for (auto& block : *func) {
    if (live_blocks.count(&block)) {
      for (auto iter = block.begin(); iter != block.end();) {
        if (iter->opcode() != spv::Op::OpPhi) {
          break;
        }

        bool changed = false;
        bool backedge_added = false;
        Instruction* inst = &*iter;
        std::vector<Operand> operands;
        // Build a complete set of operands (not just input operands). Start
        // with type and result id operands.
        operands.push_back(inst->GetOperand(0u));
        operands.push_back(inst->GetOperand(1u));
        // Iterate through the incoming labels and determine which to keep
        // and/or modify.  If there in an unreachable continue block, there will
        // be an edge from that block to the header.  We need to keep it to
        // maintain the structured control flow.  If the header has more that 2
        // incoming edges, then the OpPhi must have an entry for that edge.
        // However, if there is only one other incoming edge, the OpPhi can be
        // eliminated.
        for (uint32_t i = 1; i < inst->NumInOperands(); i += 2) {
          BasicBlock* inc = GetParentBlock(inst->GetSingleWordInOperand(i));
          auto cont_iter = unreachable_continues.find(inc);
          if (cont_iter != unreachable_continues.end() &&
              cont_iter->second == &block && inst->NumInOperands() > 4) {
            if (get_def_use_mgr()
                    ->GetDef(inst->GetSingleWordInOperand(i - 1))
                    ->opcode() == spv::Op::OpUndef) {
              // Already undef incoming value, no change necessary.
              operands.push_back(inst->GetInOperand(i - 1));
              operands.push_back(inst->GetInOperand(i));
              backedge_added = true;
            } else {
              // Replace incoming value with undef if this phi exists in the
              // loop header. Otherwise, this edge is not live since the
              // unreachable continue block will be replaced with an
              // unconditional branch to the header only.
              operands.emplace_back(
                  SPV_OPERAND_TYPE_ID,
                  std::initializer_list<uint32_t>{Type2Undef(inst->type_id())});
              operands.push_back(inst->GetInOperand(i));
              changed = true;
              backedge_added = true;
            }
          } else if (live_blocks.count(inc) && inc->IsSuccessor(&block)) {
            // Keep live incoming edge.
            operands.push_back(inst->GetInOperand(i - 1));
            operands.push_back(inst->GetInOperand(i));
          } else {
            // Remove incoming edge.
            changed = true;
          }
        }

        if (changed) {
          modified = true;
          uint32_t continue_id = block.ContinueBlockIdIfAny();
          if (!backedge_added && continue_id != 0 &&
              unreachable_continues.count(GetParentBlock(continue_id)) &&
              operands.size() > 4) {
            // Changed the backedge to branch from the continue block instead
            // of a successor of the continue block. Add an entry to the phi to
            // provide an undef for the continue block. Since the successor of
            // the continue must also be unreachable (dominated by the continue
            // block), any entry for the original backedge has been removed
            // from the phi operands.
            operands.emplace_back(
                SPV_OPERAND_TYPE_ID,
                std::initializer_list<uint32_t>{Type2Undef(inst->type_id())});
            operands.emplace_back(SPV_OPERAND_TYPE_ID,
                                  std::initializer_list<uint32_t>{continue_id});
          }

          // Either replace the phi with a single value or rebuild the phi out
          // of |operands|.
          //
          // We always have type and result id operands. So this phi has a
          // single source if there are two more operands beyond those.
          if (operands.size() == 4) {
            // First input data operands is at index 2.
            uint32_t replId = operands[2u].words[0];
            context()->KillNamesAndDecorates(inst->result_id());
            context()->ReplaceAllUsesWith(inst->result_id(), replId);
            iter = context()->KillInst(&*inst);
          } else {
            // We've rewritten the operands, so first instruct the def/use
            // manager to forget uses in the phi before we replace them. After
            // replacing operands update the def/use manager by re-analyzing
            // the used ids in this phi.
            get_def_use_mgr()->EraseUseRecordsOfOperandIds(inst);
            inst->ReplaceOperands(operands);
            get_def_use_mgr()->AnalyzeInstUse(inst);
            ++iter;
          }
        } else {
          ++iter;
        }
      }
    }
  }

  return modified;
}